

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O3

void do_objs(char *outfile)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char *__src;
  uint uVar8;
  objclass *poVar9;
  short sVar10;
  ulong uVar11;
  uint uVar12;
  size_t __n;
  ulong uVar13;
  int local_44;
  
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    do_objs_cold_2();
  }
  else {
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    fwrite("#ifndef ONAMES_H\n#define ONAMES_H\n\n",0x23,1,(FILE *)ofp);
    uVar12 = 0;
    local_44 = 0;
    bVar1 = false;
    poVar9 = objects;
    cVar7 = '\0';
    for (uVar11 = 0; (uVar11 == 0 || (poVar9[uVar11].oc_class != '\x01')); uVar11 = uVar11 + 1) {
      sVar10 = (short)uVar11;
      poVar9[uVar11].oc_descr_idx = sVar10;
      poVar9[uVar11].oc_name_idx = sVar10;
      cVar6 = cVar7;
      if (obj_descr[sVar10].oc_name != (char *)0x0) {
        strncpy(&tmpdup_buf,obj_descr[sVar10].oc_name,0x7f);
        cVar5 = poVar9[uVar11].oc_class;
        uVar8 = uVar12;
        if (((cVar5 != cVar7) && (cVar6 = cVar5, uVar8 = 0, uVar12 != 0)) && (uVar12 != 1000)) {
          fprintf(_stderr,"prob error for class %d (%d%%)",(ulong)(uint)(int)cVar7,(ulong)uVar12);
          fflush(_stderr);
          bVar1 = true;
          cVar6 = objects[uVar11].oc_class;
          uVar8 = 0;
        }
        if (tmpdup_buf != '\0') {
          pcVar4 = &DAT_0014f2b1;
          cVar7 = tmpdup_buf;
          do {
            if ((byte)(cVar7 + 0x9fU) < 0x1a) {
              cVar5 = cVar7 + -0x20;
LAB_0010993a:
              pcVar4[-1] = cVar5;
            }
            else {
              cVar5 = '_';
              if ((byte)(cVar7 + 0xa5U) < 0xe6) goto LAB_0010993a;
            }
            cVar7 = *pcVar4;
            pcVar4 = pcVar4 + 1;
          } while (cVar7 != '\0');
        }
        switch(cVar6) {
        case '\x04':
          pcVar4 = "#define\tRIN_";
          break;
        case '\x05':
          fwrite("#define\t",8,1,(FILE *)ofp);
          __n = 0x28;
          if ((*(ushort *)&objects[uVar11].field_0x11 & 0x1f0) != 0x120) goto LAB_00109a3b;
          fprintf((FILE *)ofp,"FAKE_AMULET_OF_YENDOR\t%d\n",uVar11 & 0xffffffff);
          goto LAB_00109a77;
        default:
          fwrite("#define\t",8,1,(FILE *)ofp);
          __n = 0x28;
          goto LAB_00109a3b;
        case '\b':
          pcVar4 = "#define\tPOT_";
          break;
        case '\t':
          pcVar4 = "#define\tSCR_";
          break;
        case '\n':
          fwrite("#define\tSPE_",0xc,1,(FILE *)ofp);
          local_44 = local_44 + 1;
          goto LAB_00109a35;
        case '\v':
          pcVar4 = "#define\tWAN_";
        }
        fwrite(pcVar4,0xc,1,(FILE *)ofp);
LAB_00109a35:
        __n = 0x24;
LAB_00109a3b:
        pFVar2 = ofp;
        strncpy(temp,&tmpdup_buf,__n);
        temp[__n] = '\0';
        fprintf((FILE *)pFVar2,"%s\t%d\n",temp,uVar11 & 0xffffffff);
LAB_00109a77:
        uVar12 = uVar8 + (int)objects[uVar11].oc_prob;
        poVar9 = objects;
      }
      cVar7 = cVar6;
    }
    if ((uVar12 != 0) && (uVar12 != 1000)) {
      do_objs_cold_1();
      bVar1 = true;
    }
    uVar13 = 1;
    fwrite("#define\tLAST_GEM\t(JADE)\n",0x18,1,(FILE *)ofp);
    fprintf((FILE *)ofp,"#define\tMAXSPELL\t%d\n",(ulong)(local_44 + 1));
    fprintf((FILE *)ofp,"#define\tNUM_OBJECTS\t%d\n",uVar11 & 0xffffffff);
    fwrite("\n/* Artifacts (unique objects) */\n\n",0x23,1,(FILE *)ofp);
    do {
      strncpy(&tmpdup_buf,artifact_names[uVar13],0x7f);
      if (tmpdup_buf != '\0') {
        pcVar4 = &DAT_0014f2b1;
        cVar7 = tmpdup_buf;
        do {
          if ((byte)(cVar7 + 0x9fU) < 0x1a) {
            cVar6 = cVar7 + -0x20;
LAB_00109bd8:
            pcVar4[-1] = cVar6;
          }
          else {
            cVar6 = '_';
            if ((byte)(cVar7 + 0xa5U) < 0xe6) goto LAB_00109bd8;
          }
          cVar7 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (cVar7 != '\0');
      }
      pcVar4 = &tmpdup_buf;
      if (_tmpdup_buf == 0x5f454854) {
        pcVar4 = &DAT_0014f2b4;
      }
      __src = &DAT_0014f2b9;
      if (_tmpdup_buf == 0x5f454854) {
        __src = &DAT_0014f2bd;
      }
      iVar3 = strncmp(pcVar4,"PLATINUM_",9);
      pFVar2 = ofp;
      if (iVar3 != 0) {
        __src = pcVar4;
      }
      strncpy(temp,__src,0x24);
      temp[0x24] = '\0';
      fprintf((FILE *)pFVar2,"#define\tART_%s\t%d\n",temp,uVar13 & 0xffffffff);
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x25);
    fprintf((FILE *)ofp,"#define\tNROFARTIFACTS\t%d\n",0x24);
    fwrite("\n#endif /* ONAMES_H */\n",0x17,1,(FILE *)ofp);
    fclose((FILE *)ofp);
    if (!bVar1) {
      return;
    }
  }
  exit(1);
}

Assistant:

void do_objs(const char *outfile)
{
	int i, sum = 0;
	char *c, *objnam;
	int nspell = 0;
	int prefix = 0;
	char class = '\0';
	boolean	sumerr = FALSE;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp,"%s",Dont_Edit_Code);
	fprintf(ofp,"#ifndef ONAMES_H\n#define ONAMES_H\n\n");

	for (i = 0; !i || objects[i].oc_class != ILLOBJ_CLASS; i++) {
		objects[i].oc_name_idx = objects[i].oc_descr_idx = i;	/* init */
		if (!(objnam = tmpdup(OBJ_NAME(objects[i])))) continue;

		/* make sure probabilities add up to 1000 */
		if (objects[i].oc_class != class) {
			if (sum && sum != 1000) {
			    fprintf(stderr, "prob error for class %d (%d%%)",
				    class, sum);
			    fflush(stderr);
			    sumerr = TRUE;
			}
			class = objects[i].oc_class;
			sum = 0;
		}

		for (c = objnam; *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';

		switch (class) {
		    case WAND_CLASS:
			fprintf(ofp,"#define\tWAN_"); prefix = 1; break;
		    case RING_CLASS:
			fprintf(ofp,"#define\tRIN_"); prefix = 1; break;
		    case POTION_CLASS:
			fprintf(ofp,"#define\tPOT_"); prefix = 1; break;
		    case SPBOOK_CLASS:
			fprintf(ofp,"#define\tSPE_"); prefix = 1; nspell++; break;
		    case SCROLL_CLASS:
			fprintf(ofp,"#define\tSCR_"); prefix = 1; break;
		    case AMULET_CLASS:
			/* avoid trouble with stupid C preprocessors */
			fprintf(ofp,"#define\t");
			if (objects[i].oc_material == PLASTIC) {
			    fprintf(ofp,"FAKE_AMULET_OF_YENDOR\t%d\n", i);
			    prefix = -1;
			    break;
			}
			break;
		    default:
			fprintf(ofp,"#define\t");
		}
		if (prefix >= 0)
			fprintf(ofp,"%s\t%d\n", limit(objnam, prefix), i);
		prefix = 0;

		sum += objects[i].oc_prob;
	}

	/* check last set of probabilities */
	if (sum && sum != 1000) {
	    fprintf(stderr, "prob error for class %d (%d%%)", class, sum);
	    fflush(stderr);
	    sumerr = TRUE;
	}

	fprintf(ofp,"#define\tLAST_GEM\t(JADE)\n");
	fprintf(ofp,"#define\tMAXSPELL\t%d\n", nspell+1);
	fprintf(ofp,"#define\tNUM_OBJECTS\t%d\n", i);

	fprintf(ofp, "\n/* Artifacts (unique objects) */\n\n");

	for (i = 1; artifact_names[i]; i++) {
		for (c = objnam = tmpdup(artifact_names[i]); *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';

		if (!strncmp(objnam, "THE_", 4))
			objnam += 4;
		/* fudge _platinum_ YENDORIAN EXPRESS CARD */
		if (!strncmp(objnam, "PLATINUM_", 9))
			objnam += 9;
		fprintf(ofp,"#define\tART_%s\t%d\n", limit(objnam, 1), i);
	}

	fprintf(ofp, "#define\tNROFARTIFACTS\t%d\n", i-1);
	fprintf(ofp,"\n#endif /* ONAMES_H */\n");
	fclose(ofp);
	if (sumerr) exit(EXIT_FAILURE);
	return;
}